

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O2

error_info * __thiscall
toml::make_error_info<char_const(&)[96]>
          (error_info *__return_storage_ptr__,toml *this,string *title,source_location *loc,
          string *msg,char (*tail) [96])

{
  error_info ei;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  error_info local_148;
  error_info local_f0;
  source_location local_98;
  
  std::__cxx11::string::string
            (&local_168,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::source_location(&local_98,(source_location *)title);
  std::__cxx11::string::string
            (&local_188,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"",&local_1c9);
  error_info::error_info(&local_f0,(string *)&local_168,&local_98,(string *)&local_188,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  source_location::~source_location(&local_98);
  std::__cxx11::string::~string((string *)&local_168);
  error_info::error_info(&local_148,&local_f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,(char *)msg,&local_1c9);
  detail::make_error_info_rec(__return_storage_ptr__,&local_148,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  error_info::~error_info(&local_148);
  error_info::~error_info(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}